

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t readback_bytes(mime_state *state,char *buffer,size_t bufsize,char *bytes,size_t numbytes,
                     char *trail)

{
  ulong uVar1;
  size_t sVar2;
  char *__src;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = state->offset;
  uVar4 = uVar1 - numbytes;
  if (uVar1 < numbytes) {
    uVar3 = numbytes - uVar1;
    __src = bytes + uVar1;
  }
  else {
    sVar2 = strlen(trail);
    uVar3 = sVar2 - uVar4;
    if (sVar2 < uVar4 || uVar3 == 0) {
      return 0;
    }
    __src = trail + uVar4;
  }
  if (uVar3 < bufsize) {
    bufsize = uVar3;
  }
  memcpy(buffer,__src,bufsize);
  state->offset = state->offset + bufsize;
  return bufsize;
}

Assistant:

static size_t readback_bytes(mime_state *state,
                             char *buffer, size_t bufsize,
                             const char *bytes, size_t numbytes,
                             const char *trail)
{
  size_t sz;

  if(numbytes > state->offset) {
    sz = numbytes - state->offset;
    bytes += state->offset;
  }
  else {
    size_t tsz = strlen(trail);

    sz = state->offset - numbytes;
    if(sz >= tsz)
      return 0;
    bytes = trail + sz;
    sz = tsz - sz;
  }

  if(sz > bufsize)
    sz = bufsize;

  memcpy(buffer, bytes, sz);
  state->offset += sz;
  return sz;
}